

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O1

bool dxil_spv::emit_interpolate_instruction(GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  GLSLstd450 GVar1;
  bool bVar2;
  Id IVar3;
  uint uVar4;
  ValueKind VVar5;
  Id IVar6;
  Builder *this;
  mapped_type *pmVar7;
  Operation *pOVar8;
  Value *pVVar9;
  Constant *this_00;
  APInt *this_01;
  int64_t iVar10;
  Builder *this_02;
  uint i;
  long lVar11;
  bool bVar12;
  Id offsets [2];
  uint32_t input_element_index;
  Id local_70 [3];
  GLSLstd450 local_64;
  Id local_60;
  uint32_t local_5c;
  Id local_58;
  Id local_54;
  mapped_type *local_50;
  initializer_list<unsigned_int> local_48;
  CallInst *local_38;
  
  this = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand(&instruction->super_Instruction,1,&local_5c);
  if (bVar2) {
    pmVar7 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->input_elements_meta,&local_5c);
    IVar6 = pmVar7->id;
    IVar3 = spv::Builder::getDerefTypeId(this,IVar6);
    uVar4 = spv::Builder::getNumTypeConstituents(this,IVar3);
    local_64 = opcode;
    local_50 = pmVar7;
    if (1 < uVar4) {
      IVar3 = Converter::Impl::get_effective_input_output_type_id(impl,pmVar7->component_type);
      IVar3 = spv::Builder::makePointer(this,StorageClassInput,IVar3);
      pOVar8 = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
      local_58 = IVar6;
      pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
      local_54 = Converter::Impl::get_id_for_value(impl,pVVar9,0x20);
      local_48._M_len = 2;
      local_48._M_array = &local_58;
      Operation::add_ids(pOVar8,&local_48);
      Converter::Impl::add(impl,pOVar8,false);
      IVar6 = pOVar8->id;
    }
    GVar1 = local_64;
    if (impl->glsl_std450_ext == 0) {
      IVar3 = spv::Builder::import(this,"GLSL.std.450");
      impl->glsl_std450_ext = IVar3;
    }
    local_60 = IVar6;
    if (GVar1 == GLSLstd450InterpolateAtSample) {
      pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
    }
    else {
      IVar6 = 0;
      if (GVar1 == GLSLstd450InterpolateAtOffset) {
        local_70[0] = 0;
        local_70[1] = 0;
        lVar11 = 0;
        bVar12 = false;
        local_38 = instruction;
        do {
          pVVar9 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)lVar11 + 4);
          if (pVVar9 == (Value *)0x0) {
            this_00 = (Constant *)0x0;
          }
          else {
            this_00 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar9);
            VVar5 = LLVMBC::Value::get_value_kind((Value *)this_00);
            if (VVar5 != ConstantInt) {
              this_00 = (Constant *)0x0;
            }
          }
          if (this_00 == (Constant *)0x0) {
            pVVar9 = LLVMBC::Instruction::getOperand
                               (&instruction->super_Instruction,(int)lVar11 + 4);
            IVar6 = Converter::Impl::get_id_for_value(impl,pVVar9,0);
            local_70[lVar11] = IVar6;
            this_02 = Converter::Impl::builder(impl);
            IVar3 = spv::Builder::makeIntegerType(this_02,0x20,false);
            pOVar8 = Converter::Impl::allocate(impl,OpBitFieldSExtract,IVar3);
            Operation::add_id(pOVar8,IVar6);
            IVar6 = spv::Builder::makeIntegerType(this_02,0x20,false);
            IVar6 = spv::Builder::makeIntConstant(this_02,IVar6,0,false);
            Operation::add_id(pOVar8,IVar6);
            IVar6 = spv::Builder::makeIntegerType(this_02,0x20,false);
            IVar6 = spv::Builder::makeIntConstant(this_02,IVar6,4,false);
            Operation::add_id(pOVar8,IVar6);
            IVar6 = pOVar8->id;
            Converter::Impl::add(impl,pOVar8,false);
            IVar3 = spv::Builder::makeFloatType(this_02,0x20);
            pOVar8 = Converter::Impl::allocate(impl,OpConvertSToF,IVar3);
            Operation::add_id(pOVar8,IVar6);
            IVar6 = pOVar8->id;
            Converter::Impl::add(impl,pOVar8,false);
            IVar3 = spv::Builder::makeFloatType(this_02,0x20);
            pOVar8 = Converter::Impl::allocate(impl,OpFMul,IVar3);
            local_58 = IVar6;
            local_54 = spv::Builder::makeFloatConstant(this_02,0.0625,false);
            local_48._M_array = &local_58;
            local_48._M_len = 2;
            Operation::add_ids(pOVar8,&local_48);
            IVar6 = pOVar8->id;
            Converter::Impl::add(impl,pOVar8,false);
            local_70[lVar11] = IVar6;
            bVar12 = true;
            instruction = local_38;
          }
          else {
            this_01 = LLVMBC::Constant::getUniqueInteger(this_00);
            iVar10 = LLVMBC::APInt::getSExtValue(this_01);
            IVar6 = spv::Builder::makeFloatConstant(this,(float)iVar10 * 0.0625,false);
            local_70[lVar11] = IVar6;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 == 1);
        IVar6 = spv::Builder::makeFloatType(this,0x20);
        if (bVar12) {
          IVar6 = Converter::Impl::build_vector(impl,IVar6,local_70,2);
        }
        else {
          IVar6 = Converter::Impl::build_constant_vector(impl,IVar6,local_70,2);
        }
      }
    }
    IVar3 = Converter::Impl::get_effective_input_output_type_id(impl,local_50->component_type);
    pOVar8 = Converter::Impl::allocate(impl,OpExtInst,(Value *)instruction,IVar3);
    Operation::add_id(pOVar8,impl->glsl_std450_ext);
    Operation::add_literal(pOVar8,local_64);
    Operation::add_id(pOVar8,local_60);
    if (IVar6 != 0) {
      Operation::add_id(pOVar8,IVar6);
    }
    Converter::Impl::add(impl,pOVar8,false);
    Converter::Impl::fixup_load_type_io(impl,local_50->component_type,1,(Value *)instruction);
    local_48._M_array = (iterator)CONCAT44(local_48._M_array._4_4_,0x34);
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&this->capabilities,(Capability *)&local_48);
  }
  return bVar2;
}

Assistant:

bool emit_interpolate_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t input_element_index;
	if (!get_constant_operand(instruction, 1, &input_element_index))
		return false;

	const auto &meta = impl.input_elements_meta[input_element_index];
	uint32_t var_id = meta.id;
	uint32_t ptr_id;

	uint32_t num_rows = builder.getNumTypeComponents(builder.getDerefTypeId(var_id));

	if (num_rows > 1)
	{
		// Need to deal with signed vs unsigned here.
		Operation *op =
			impl.allocate(spv::OpAccessChain,
			              builder.makePointer(spv::StorageClassInput,
			                                  impl.get_effective_input_output_type_id(meta.component_type)));

		op->add_ids({ var_id, impl.get_id_for_value(instruction->getOperand(3), 32) });
		impl.add(op);
		ptr_id = op->id;
	}
	else
		ptr_id = var_id;

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	spv::Id aux_id = 0;

	if (opcode == GLSLstd450InterpolateAtOffset)
	{
		spv::Id offsets[2] = {};
		bool is_non_const = false;
		for (unsigned i = 0; i < 2; i++)
		{
			auto *operand = instruction->getOperand(4 + i);
			auto *constant_operand = llvm::dyn_cast<llvm::ConstantInt>(operand);

			// Need to do it the tedious way, extracting bits and converting to float ...
			if (!constant_operand)
			{
				offsets[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
				offsets[i] = build_attribute_offset(offsets[i], impl);
				is_non_const = true;
			}
			else
			{
				float off = float(constant_operand->getUniqueInteger().getSExtValue()) / 16.0f;
				offsets[i] = builder.makeFloatConstant(off);
			}
		}

		if (is_non_const)
			aux_id = impl.build_vector(builder.makeFloatType(32), offsets, 2);
		else
			aux_id = impl.build_constant_vector(builder.makeFloatType(32), offsets, 2);
	}
	else if (opcode == GLSLstd450InterpolateAtSample)
		aux_id = impl.get_id_for_value(instruction->getOperand(4));

	// Need to deal with signed vs unsigned here.
	Operation *op = impl.allocate(spv::OpExtInst, instruction,
	                              impl.get_effective_input_output_type_id(meta.component_type));
	op->add_id(impl.glsl_std450_ext);
	op->add_literal(opcode);
	op->add_id(ptr_id);

	if (aux_id)
		op->add_id(aux_id);

	impl.add(op);

	// Need to bitcast after we load.
	impl.fixup_load_type_io(meta.component_type, 1, instruction);
	builder.addCapability(spv::CapabilityInterpolationFunction);
	return true;
}